

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_test_control(int op,...)

{
  sqlite3_mutex **ppsVar1;
  uint sz_00;
  sqlite3 *xBenignBegin_00;
  _func_void *xBenignEnd_00;
  char in_AL;
  byte bVar2;
  int iVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int *local_340;
  undefined4 *local_328;
  undefined8 *local_310;
  uint local_1ec;
  undefined1 local_138 [8];
  sqlite3 *local_130;
  _func_void *local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  sqlite3 *local_80;
  sqlite3 *db_3;
  sqlite3 *db_2;
  sqlite3 *db_1;
  sqlite3 *psStack_60;
  int x_2;
  sqlite3 *db;
  int x_1;
  int x;
  uint newVal;
  void_function xBenignEnd;
  void_function xBenignBegin;
  int *aProg;
  uint local_28;
  int sz;
  va_list ap;
  int rc;
  int op_local;
  
  xBenignEnd_00 = local_128;
  xBenignBegin_00 = local_130;
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  ap[0].reg_save_area._0_4_ = 0;
  ap[0].overflow_arg_area = local_138;
  ap[0]._0_8_ = &stack0x00000008;
  sz = 0x30;
  local_28 = 8;
  sz_00 = (uint)local_130;
  local_120 = in_RCX;
  local_118 = in_R8;
  local_110 = in_R9;
  ap[0].reg_save_area._4_4_ = op;
  switch(op) {
  case 5:
    local_130 = (sqlite3 *)in_RSI;
    local_128 = (_func_void *)in_RDX;
    sqlite3PrngSaveState();
    break;
  case 6:
    local_130 = (sqlite3 *)in_RSI;
    local_128 = (_func_void *)in_RDX;
    sqlite3PrngRestoreState();
    break;
  case 7:
    local_130 = (sqlite3 *)in_RSI;
    local_128 = (_func_void *)in_RDX;
    sqlite3_randomness(0,(void *)0x0);
    break;
  case 8:
    ap[0].reg_save_area._0_4_ = 0;
    sz = 0x30;
    aProg._4_4_ = (uint)local_130;
    local_28 = 0x18;
    local_130 = (sqlite3 *)in_RSI;
    local_128 = (_func_void *)in_RDX;
    ap[0].reg_save_area._0_4_ = sqlite3BitvecBuiltinTest(sz_00,(int *)xBenignEnd_00);
    break;
  case 9:
    ap[0].reg_save_area._0_4_ = 0;
    sz = 0x30;
    local_28 = 0x10;
    sqlite3Config.xTestCallback = (_func_int_int *)local_130;
    local_130 = (sqlite3 *)in_RSI;
    local_128 = (_func_void *)in_RDX;
    ap[0].reg_save_area._0_4_ = sqlite3FaultSim(0);
    break;
  case 10:
    ap[0].reg_save_area._0_4_ = 0;
    sz = 0x30;
    local_28 = 0x18;
    local_130 = (sqlite3 *)in_RSI;
    local_128 = (_func_void *)in_RDX;
    sqlite3BenignMallocHooks((_func_void *)xBenignBegin_00,xBenignEnd_00);
    break;
  case 0xb:
    ap[0].reg_save_area._0_4_ = sqlite3PendingByte;
    if ((uint)local_130 != 0) {
      sqlite3PendingByte = (uint)local_130;
    }
    break;
  case 0xc:
    ap[0].reg_save_area._0_4_ = 0;
    break;
  case 0xd:
    local_1ec = (uint)local_130;
    if ((uint)local_130 == 0) {
      local_1ec = 0;
    }
    ap[0].reg_save_area._0_4_ = local_1ec;
    break;
  case 0xe:
    ap[0].reg_save_area._0_4_ = 0;
    sz = 0x30;
    psStack_60 = local_130;
    local_28 = 0x18;
    db_1._4_4_ = (int)local_128;
    ppsVar1 = &local_130->mutex;
    local_130 = (sqlite3 *)in_RSI;
    local_128 = (_func_void *)in_RDX;
    sqlite3_mutex_enter(*ppsVar1);
    sqlite3BtreeSetPageSize(psStack_60->aDb->pBt,0,db_1._4_4_,0);
    sqlite3_mutex_leave(psStack_60->mutex);
    break;
  case 0xf:
    ap[0].reg_save_area._0_4_ = 0;
    local_130->dbOptFlags = (u16)local_128;
    break;
  case 0x11:
    ap[0].reg_save_area._0_4_ = 0;
    sqlite3Config.bInternalFunctions = (uint)local_130;
    break;
  case 0x12:
    ap[0].reg_save_area._0_4_ = 0;
    sqlite3Config.bLocaltimeFault = (uint)local_130;
    break;
  case 0x13:
    ap[0].reg_save_area._0_4_ = 0;
    sqlite3Config.iOnceResetThreshold = (uint)local_130;
    break;
  case 0x14:
    ap[0].reg_save_area._0_4_ = 0;
    sqlite3Config.neverCorrupt = (uint)local_130;
    break;
  case 0x15:
    break;
  case 0x16:
    ap[0].reg_save_area._0_4_ = 0x1e212;
    break;
  case 0x17:
    ap[0].reg_save_area._1_3_ = 0;
    ap[0].reg_save_area._0_1_ = sqlite3Config.isInit == 0;
    break;
  case 0x18:
    ap[0].reg_save_area._0_4_ = 0;
    local_130->nMaxSorterMmap = (int)local_128;
    break;
  case 0x19:
    ap[0].reg_save_area._0_4_ = 0;
    sz = 0x30;
    local_28 = 0x10;
    local_80 = local_130;
    ppsVar1 = &local_130->mutex;
    local_130 = (sqlite3 *)in_RSI;
    local_128 = (_func_void *)in_RDX;
    sqlite3_mutex_enter(*ppsVar1);
    if (local_28 < 0x29) {
      local_310 = (undefined8 *)((long)(int)local_28 + (long)ap[0].overflow_arg_area);
      local_28 = local_28 + 8;
    }
    else {
      local_310 = (undefined8 *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    iVar3 = sqlite3FindDbName(local_80,(char *)*local_310);
    (local_80->init).iDb = (u8)iVar3;
    if (local_28 < 0x29) {
      local_328 = (undefined4 *)((long)(int)local_28 + (long)ap[0].overflow_arg_area);
      local_28 = local_28 + 8;
    }
    else {
      local_328 = (undefined4 *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    bVar2 = (byte)*local_328 & 1;
    (local_80->init).field_0x6 = (local_80->init).field_0x6 & 0xfd | bVar2 << 1;
    (local_80->init).busy = bVar2;
    if (local_28 < 0x29) {
      local_340 = (int *)((long)(int)local_28 + (long)ap[0].overflow_arg_area);
      local_28 = local_28 + 8;
    }
    else {
      local_340 = (int *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    (local_80->init).newTnum = *local_340;
    if (((local_80->init).busy == '\0') && (0 < (local_80->init).newTnum)) {
      sqlite3ResetAllSchemasOfConnection(local_80);
    }
    sqlite3_mutex_leave(local_80->mutex);
  }
  return (uint)ap[0].reg_save_area;
}

Assistant:

SQLITE_API int sqlite3_test_control(int op, ...){
  int rc = 0;
#ifdef SQLITE_UNTESTABLE
  UNUSED_PARAMETER(op);
#else
  va_list ap;
  va_start(ap, op);
  switch( op ){

    /*
    ** Save the current state of the PRNG.
    */
    case SQLITE_TESTCTRL_PRNG_SAVE: {
      sqlite3PrngSaveState();
      break;
    }

    /*
    ** Restore the state of the PRNG to the last state saved using
    ** PRNG_SAVE.  If PRNG_SAVE has never before been called, then
    ** this verb acts like PRNG_RESET.
    */
    case SQLITE_TESTCTRL_PRNG_RESTORE: {
      sqlite3PrngRestoreState();
      break;
    }

    /*
    ** Reset the PRNG back to its uninitialized state.  The next call
    ** to sqlite3_randomness() will reseed the PRNG using a single call
    ** to the xRandomness method of the default VFS.
    */
    case SQLITE_TESTCTRL_PRNG_RESET: {
      sqlite3_randomness(0,0);
      break;
    }

    /*
    **  sqlite3_test_control(BITVEC_TEST, size, program)
    **
    ** Run a test against a Bitvec object of size.  The program argument
    ** is an array of integers that defines the test.  Return -1 on a
    ** memory allocation error, 0 on success, or non-zero for an error.
    ** See the sqlite3BitvecBuiltinTest() for additional information.
    */
    case SQLITE_TESTCTRL_BITVEC_TEST: {
      int sz = va_arg(ap, int);
      int *aProg = va_arg(ap, int*);
      rc = sqlite3BitvecBuiltinTest(sz, aProg);
      break;
    }

    /*
    **  sqlite3_test_control(FAULT_INSTALL, xCallback)
    **
    ** Arrange to invoke xCallback() whenever sqlite3FaultSim() is called,
    ** if xCallback is not NULL.
    **
    ** As a test of the fault simulator mechanism itself, sqlite3FaultSim(0)
    ** is called immediately after installing the new callback and the return
    ** value from sqlite3FaultSim(0) becomes the return from
    ** sqlite3_test_control().
    */
    case SQLITE_TESTCTRL_FAULT_INSTALL: {
      /* MSVC is picky about pulling func ptrs from va lists.
      ** http://support.microsoft.com/kb/47961
      ** sqlite3GlobalConfig.xTestCallback = va_arg(ap, int(*)(int));
      */
      typedef int(*TESTCALLBACKFUNC_t)(int);
      sqlite3GlobalConfig.xTestCallback = va_arg(ap, TESTCALLBACKFUNC_t);
      rc = sqlite3FaultSim(0);
      break;
    }

    /*
    **  sqlite3_test_control(BENIGN_MALLOC_HOOKS, xBegin, xEnd)
    **
    ** Register hooks to call to indicate which malloc() failures 
    ** are benign.
    */
    case SQLITE_TESTCTRL_BENIGN_MALLOC_HOOKS: {
      typedef void (*void_function)(void);
      void_function xBenignBegin;
      void_function xBenignEnd;
      xBenignBegin = va_arg(ap, void_function);
      xBenignEnd = va_arg(ap, void_function);
      sqlite3BenignMallocHooks(xBenignBegin, xBenignEnd);
      break;
    }

    /*
    **  sqlite3_test_control(SQLITE_TESTCTRL_PENDING_BYTE, unsigned int X)
    **
    ** Set the PENDING byte to the value in the argument, if X>0.
    ** Make no changes if X==0.  Return the value of the pending byte
    ** as it existing before this routine was called.
    **
    ** IMPORTANT:  Changing the PENDING byte from 0x40000000 results in
    ** an incompatible database file format.  Changing the PENDING byte
    ** while any database connection is open results in undefined and
    ** deleterious behavior.
    */
    case SQLITE_TESTCTRL_PENDING_BYTE: {
      rc = PENDING_BYTE;
#ifndef SQLITE_OMIT_WSD
      {
        unsigned int newVal = va_arg(ap, unsigned int);
        if( newVal ) sqlite3PendingByte = newVal;
      }
#endif
      break;
    }

    /*
    **  sqlite3_test_control(SQLITE_TESTCTRL_ASSERT, int X)
    **
    ** This action provides a run-time test to see whether or not
    ** assert() was enabled at compile-time.  If X is true and assert()
    ** is enabled, then the return value is true.  If X is true and
    ** assert() is disabled, then the return value is zero.  If X is
    ** false and assert() is enabled, then the assertion fires and the
    ** process aborts.  If X is false and assert() is disabled, then the
    ** return value is zero.
    */
    case SQLITE_TESTCTRL_ASSERT: {
      volatile int x = 0;
      assert( /*side-effects-ok*/ (x = va_arg(ap,int))!=0 );
      rc = x;
      break;
    }


    /*
    **  sqlite3_test_control(SQLITE_TESTCTRL_ALWAYS, int X)
    **
    ** This action provides a run-time test to see how the ALWAYS and
    ** NEVER macros were defined at compile-time.
    **
    ** The return value is ALWAYS(X) if X is true, or 0 if X is false.
    **
    ** The recommended test is X==2.  If the return value is 2, that means
    ** ALWAYS() and NEVER() are both no-op pass-through macros, which is the
    ** default setting.  If the return value is 1, then ALWAYS() is either
    ** hard-coded to true or else it asserts if its argument is false.
    ** The first behavior (hard-coded to true) is the case if
    ** SQLITE_TESTCTRL_ASSERT shows that assert() is disabled and the second
    ** behavior (assert if the argument to ALWAYS() is false) is the case if
    ** SQLITE_TESTCTRL_ASSERT shows that assert() is enabled.
    **
    ** The run-time test procedure might look something like this:
    **
    **    if( sqlite3_test_control(SQLITE_TESTCTRL_ALWAYS, 2)==2 ){
    **      // ALWAYS() and NEVER() are no-op pass-through macros
    **    }else if( sqlite3_test_control(SQLITE_TESTCTRL_ASSERT, 1) ){
    **      // ALWAYS(x) asserts that x is true. NEVER(x) asserts x is false.
    **    }else{
    **      // ALWAYS(x) is a constant 1.  NEVER(x) is a constant 0.
    **    }
    */
    case SQLITE_TESTCTRL_ALWAYS: {
      int x = va_arg(ap,int);
      rc = x ? ALWAYS(x) : 0;
      break;
    }

    /*
    **   sqlite3_test_control(SQLITE_TESTCTRL_BYTEORDER);
    **
    ** The integer returned reveals the byte-order of the computer on which
    ** SQLite is running:
    **
    **       1     big-endian,    determined at run-time
    **      10     little-endian, determined at run-time
    **  432101     big-endian,    determined at compile-time
    **  123410     little-endian, determined at compile-time
    */ 
    case SQLITE_TESTCTRL_BYTEORDER: {
      rc = SQLITE_BYTEORDER*100 + SQLITE_LITTLEENDIAN*10 + SQLITE_BIGENDIAN;
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_RESERVE, sqlite3 *db, int N)
    **
    ** Set the nReserve size to N for the main database on the database
    ** connection db.
    */
    case SQLITE_TESTCTRL_RESERVE: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      int x = va_arg(ap,int);
      sqlite3_mutex_enter(db->mutex);
      sqlite3BtreeSetPageSize(db->aDb[0].pBt, 0, x, 0);
      sqlite3_mutex_leave(db->mutex);
      break;
    }

    /*  sqlite3_test_control(SQLITE_TESTCTRL_OPTIMIZATIONS, sqlite3 *db, int N)
    **
    ** Enable or disable various optimizations for testing purposes.  The 
    ** argument N is a bitmask of optimizations to be disabled.  For normal
    ** operation N should be 0.  The idea is that a test program (like the
    ** SQL Logic Test or SLT test module) can run the same SQL multiple times
    ** with various optimizations disabled to verify that the same answer
    ** is obtained in every case.
    */
    case SQLITE_TESTCTRL_OPTIMIZATIONS: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      db->dbOptFlags = (u16)(va_arg(ap, int) & 0xffff);
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_LOCALTIME_FAULT, int onoff);
    **
    ** If parameter onoff is non-zero, subsequent calls to localtime()
    ** and its variants fail. If onoff is zero, undo this setting.
    */
    case SQLITE_TESTCTRL_LOCALTIME_FAULT: {
      sqlite3GlobalConfig.bLocaltimeFault = va_arg(ap, int);
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_INTERNAL_FUNCS, int onoff);
    **
    ** If parameter onoff is non-zero, internal-use-only SQL functions
    ** are visible to ordinary SQL.  This is useful for testing but is
    ** unsafe because invalid parameters to those internal-use-only functions
    ** can result in crashes or segfaults.
    */
    case SQLITE_TESTCTRL_INTERNAL_FUNCTIONS: {
      sqlite3GlobalConfig.bInternalFunctions = va_arg(ap, int);
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_NEVER_CORRUPT, int);
    **
    ** Set or clear a flag that indicates that the database file is always well-
    ** formed and never corrupt.  This flag is clear by default, indicating that
    ** database files might have arbitrary corruption.  Setting the flag during
    ** testing causes certain assert() statements in the code to be activated
    ** that demonstrat invariants on well-formed database files.
    */
    case SQLITE_TESTCTRL_NEVER_CORRUPT: {
      sqlite3GlobalConfig.neverCorrupt = va_arg(ap, int);
      break;
    }

    /* Set the threshold at which OP_Once counters reset back to zero.
    ** By default this is 0x7ffffffe (over 2 billion), but that value is
    ** too big to test in a reasonable amount of time, so this control is
    ** provided to set a small and easily reachable reset value.
    */
    case SQLITE_TESTCTRL_ONCE_RESET_THRESHOLD: {
      sqlite3GlobalConfig.iOnceResetThreshold = va_arg(ap, int);
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_VDBE_COVERAGE, xCallback, ptr);
    **
    ** Set the VDBE coverage callback function to xCallback with context 
    ** pointer ptr.
    */
    case SQLITE_TESTCTRL_VDBE_COVERAGE: {
#ifdef SQLITE_VDBE_COVERAGE
      typedef void (*branch_callback)(void*,unsigned int,
                                      unsigned char,unsigned char);
      sqlite3GlobalConfig.xVdbeBranch = va_arg(ap,branch_callback);
      sqlite3GlobalConfig.pVdbeBranchArg = va_arg(ap,void*);
#endif
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_SORTER_MMAP, db, nMax); */
    case SQLITE_TESTCTRL_SORTER_MMAP: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      db->nMaxSorterMmap = va_arg(ap, int);
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_ISINIT);
    **
    ** Return SQLITE_OK if SQLite has been initialized and SQLITE_ERROR if
    ** not.
    */
    case SQLITE_TESTCTRL_ISINIT: {
      if( sqlite3GlobalConfig.isInit==0 ) rc = SQLITE_ERROR;
      break;
    }

    /*  sqlite3_test_control(SQLITE_TESTCTRL_IMPOSTER, db, dbName, onOff, tnum);
    **
    ** This test control is used to create imposter tables.  "db" is a pointer
    ** to the database connection.  dbName is the database name (ex: "main" or
    ** "temp") which will receive the imposter.  "onOff" turns imposter mode on
    ** or off.  "tnum" is the root page of the b-tree to which the imposter
    ** table should connect.
    **
    ** Enable imposter mode only when the schema has already been parsed.  Then
    ** run a single CREATE TABLE statement to construct the imposter table in
    ** the parsed schema.  Then turn imposter mode back off again.
    **
    ** If onOff==0 and tnum>0 then reset the schema for all databases, causing
    ** the schema to be reparsed the next time it is needed.  This has the
    ** effect of erasing all imposter tables.
    */
    case SQLITE_TESTCTRL_IMPOSTER: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      sqlite3_mutex_enter(db->mutex);
      db->init.iDb = sqlite3FindDbName(db, va_arg(ap,const char*));
      db->init.busy = db->init.imposterTable = va_arg(ap,int);
      db->init.newTnum = va_arg(ap,int);
      if( db->init.busy==0 && db->init.newTnum>0 ){
        sqlite3ResetAllSchemasOfConnection(db);
      }
      sqlite3_mutex_leave(db->mutex);
      break;
    }

#if defined(YYCOVERAGE)
    /*  sqlite3_test_control(SQLITE_TESTCTRL_PARSER_COVERAGE, FILE *out)
    **
    ** This test control (only available when SQLite is compiled with
    ** -DYYCOVERAGE) writes a report onto "out" that shows all
    ** state/lookahead combinations in the parser state machine
    ** which are never exercised.  If any state is missed, make the
    ** return code SQLITE_ERROR.
    */
    case SQLITE_TESTCTRL_PARSER_COVERAGE: {
      FILE *out = va_arg(ap, FILE*);
      if( sqlite3ParserCoverage(out) ) rc = SQLITE_ERROR;
      break;
    }
#endif /* defined(YYCOVERAGE) */
  }
  va_end(ap);
#endif /* SQLITE_UNTESTABLE */
  return rc;
}